

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_input_assembly_state
          (Impl *this,Value *ia,VkPipelineInputAssemblyStateCreateInfo **out_info)

{
  bool bVar1;
  VkPipelineInputAssemblyStateCreateInfo *pVVar2;
  Type pGVar3;
  Number NVar4;
  undefined8 local_30;
  
  pVVar2 = (VkPipelineInputAssemblyStateCreateInfo *)
           ScratchAllocator::allocate_raw(&this->allocator,0x20,0x10);
  if (pVVar2 != (VkPipelineInputAssemblyStateCreateInfo *)0x0) {
    pVVar2->flags = 0;
    pVVar2->topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
    *(undefined8 *)&pVVar2->primitiveRestartEnable = 0;
    *(undefined8 *)&pVVar2->field_0x4 = 0;
    *(undefined8 *)((long)&pVVar2->pNext + 4) = 0;
  }
  pVVar2->sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)ia,"flags");
  if ((undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    pVVar2->flags = (pGVar3->data_).s.length;
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)ia,"primitiveRestartEnable");
    if ((undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      pVVar2->primitiveRestartEnable = (pGVar3->data_).s.length;
      pGVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)ia,"topology");
      if ((undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x40000000000000)
          != (undefined1  [16])0x0) {
        pVVar2->topology = (pGVar3->data_).s.length;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&stack0xffffffffffffffd0,(Ch *)ia);
        NVar4.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(ia);
        if (local_30 != NVar4.i64) {
          pGVar3 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)ia,"pNext");
          bVar1 = parse_pnext_chain(this,pGVar3,&pVVar2->pNext,(StateCreatorInterface *)0x0,
                                    (DatabaseInterface *)0x0,(Value *)0x0);
          if (!bVar1) {
            return false;
          }
        }
        *out_info = pVVar2;
        return true;
      }
    }
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_input_assembly_state(const Value &ia, const VkPipelineInputAssemblyStateCreateInfo **out_info)
{
	auto *state = allocator.allocate_cleared<VkPipelineInputAssemblyStateCreateInfo>();
	state->sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
	state->flags = ia["flags"].GetUint();
	state->primitiveRestartEnable = ia["primitiveRestartEnable"].GetUint();
	state->topology = static_cast<VkPrimitiveTopology>(ia["topology"].GetUint());

	if (ia.HasMember("pNext"))
		if (!parse_pnext_chain(ia["pNext"], &state->pNext))
			return false;

	*out_info = state;
	return true;
}